

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dist.c
# Opt level: O2

REF_STATUS
ref_dist_collisions(REF_GRID ref_grid,REF_BOOL report,char *filename,REF_INT *n_collisions)

{
  double *pdVar1;
  int iVar2;
  uint uVar3;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_DBL *pRVar4;
  uint uVar5;
  REF_STATUS RVar6;
  FILE *__s;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  double dVar13;
  double dVar14;
  undefined8 uStackY_1d0;
  REF_LIST collision_faceid;
  REF_LIST collision_node;
  REF_LIST ref_list;
  REF_SEARCH ref_search;
  REF_EDGE ref_edge;
  REF_BOOL local_18c;
  REF_DBL center [3];
  double local_140;
  REF_DBL side1;
  REF_DBL side0;
  REF_DBL vol1;
  REF_DBL vol0;
  REF_INT nodes [27];
  REF_INT local_a8 [2];
  int local_a0;
  int local_9c;
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *n_collisions = 0;
  uVar5 = ref_edge_create(&ref_edge,ref_grid);
  if (uVar5 == 0) {
    uVar5 = ref_search_create(&ref_search,ref_cell->n);
    if (uVar5 == 0) {
      local_18c = report;
      for (iVar12 = 0; iVar12 < ref_cell->max; iVar12 = iVar12 + 1) {
        RVar6 = ref_cell_nodes(ref_cell,iVar12,nodes);
        if (RVar6 == 0) {
          pRVar4 = ref_node->real;
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            center[lVar10] =
                 (pRVar4[nodes[0] * 0xf + lVar10] + pRVar4[nodes[1] * 0xf + lVar10] +
                 pRVar4[nodes[2] * 0xf + lVar10]) * 0.3333333333333333;
          }
          dVar13 = 0.0;
          for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
            lVar8 = (long)nodes[lVar10];
            dVar14 = SQRT((pRVar4[lVar8 * 0xf + 2] - center[2]) *
                          (pRVar4[lVar8 * 0xf + 2] - center[2]) +
                          (pRVar4[lVar8 * 0xf + 1] - center[1]) *
                          (pRVar4[lVar8 * 0xf + 1] - center[1]) +
                          (pRVar4[lVar8 * 0xf] - center[0]) * (pRVar4[lVar8 * 0xf] - center[0]));
            if (dVar13 <= dVar14) {
              dVar13 = dVar14;
            }
          }
          uVar5 = ref_search_insert(ref_search,iVar12,center,dVar13 * 1.01);
          if (uVar5 != 0) {
            uVar9 = (ulong)uVar5;
            pcVar11 = "insert";
            uVar7 = 0x84;
            goto LAB_0013d4af;
          }
        }
      }
      uVar5 = ref_list_create(&collision_node);
      if (uVar5 == 0) {
        uVar5 = ref_list_create(&collision_faceid);
        if (uVar5 == 0) {
          uVar5 = ref_list_create(&ref_list);
          if (uVar5 == 0) {
            lVar10 = 0;
LAB_0013d510:
            if (lVar10 < ref_edge->n) {
              pRVar4 = ref_node->real;
              iVar12 = ref_edge->e2n[lVar10 * 2 + 1];
              pdVar1 = pRVar4 + ref_edge->e2n[lVar10 * 2] * 0xf;
              for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
                center[lVar8] = (pdVar1[lVar8] + pRVar4[iVar12 * 0xf + lVar8]) * 0.5;
              }
              uVar5 = ref_search_touching(ref_search,ref_list,center,
                                          SQRT((pdVar1[2] - center[2]) * (pdVar1[2] - center[2]) +
                                               (pdVar1[1] - center[1]) * (pdVar1[1] - center[1]) +
                                               (*pdVar1 - center[0]) * (*pdVar1 - center[0])) * 1.01
                                         );
              if (uVar5 == 0) {
                lVar8 = 0;
LAB_0013d5e3:
                if (ref_list->n <= lVar8) goto LAB_0013d8ba;
                uVar5 = ref_cell_nodes(ref_cell,ref_list->value[lVar8],nodes);
                if (uVar5 != 0) {
                  uVar9 = (ulong)uVar5;
                  pcVar11 = "cell nodes";
                  uVar7 = 0x94;
                  goto LAB_0013d4af;
                }
                iVar12 = ref_edge->e2n[lVar10 * 2];
                iVar2 = ref_edge->e2n[lVar10 * 2 + 1];
                if (((nodes[0] != iVar12) || (nodes[1] != iVar2)) &&
                   ((nodes[1] != iVar12 || (nodes[2] != iVar2)))) {
                  if (((nodes[0] != iVar2 || nodes[1] != iVar12) &&
                      (nodes[0] != iVar2 && nodes[1] != iVar2 || nodes[2] != iVar12)) &&
                     (nodes[0] != iVar12 || nodes[2] != iVar2)) {
                    local_a0 = nodes[2];
                    local_9c = iVar12;
                    uVar5 = ref_node_tet_vol(ref_node,local_a8,&vol0);
                    if (uVar5 == 0) {
                      local_9c = iVar2;
                      uVar5 = ref_node_tet_vol(ref_node,local_a8,&vol1);
                      if (uVar5 == 0) {
                        if (((0.0 < vol0) && (0.0 < vol1)) || ((vol0 < 0.0 && (vol1 < 0.0))))
                        goto LAB_0013d65b;
                        local_a0 = iVar12;
                        local_9c = iVar2;
                        uVar5 = ref_node_tet_vol(ref_node,local_a8,&side0);
                        if (uVar5 == 0) {
                          uVar5 = ref_node_tet_vol(ref_node,local_a8,&side1);
                          if (uVar5 == 0) {
                            uVar5 = ref_node_tet_vol(ref_node,local_a8,&local_140);
                            if (uVar5 == 0) {
                              if ((((side0 <= 0.0) || (side1 <= 0.0)) || (local_140 <= 0.0)) &&
                                 (((0.0 <= side0 || (0.0 <= side1)) || (0.0 <= local_140))))
                              goto LAB_0013d65b;
                              uVar5 = ref_list_push(collision_node,nodes[0]);
                              if (uVar5 != 0) {
                                uVar9 = (ulong)uVar5;
                                pcVar11 = "push node";
                                uVar7 = 0x9c;
                                goto LAB_0013d4af;
                              }
                              uVar5 = ref_list_push(collision_faceid,nodes[ref_cell->node_per]);
                              uVar9 = (ulong)uVar5;
                              if (uVar5 != 0) {
                                pcVar11 = "push faceid";
                                uVar7 = 0x9e;
                                goto LAB_0013d4af;
                              }
                              *n_collisions = *n_collisions + 1;
                              if (local_18c != 0) {
                                printf("%f %f %f # self intersection of face %d\n",
                                       ref_node->real[(long)nodes[0] * 0xf],
                                       ref_node->real[(long)nodes[0] * 0xf + 1],
                                       (ulong)(uint)nodes[ref_cell->node_per]);
                              }
                              goto LAB_0013d65b;
                            }
                            uVar9 = (ulong)uVar5;
                            pcVar11 = "side2";
                            uStackY_1d0 = 0x46;
                          }
                          else {
                            uVar9 = (ulong)uVar5;
                            pcVar11 = "side1";
                            uStackY_1d0 = 0x43;
                          }
                        }
                        else {
                          uVar9 = (ulong)uVar5;
                          pcVar11 = "side0";
                          uStackY_1d0 = 0x40;
                        }
                      }
                      else {
                        uVar9 = (ulong)uVar5;
                        pcVar11 = "vol1";
                        uStackY_1d0 = 0x37;
                      }
                    }
                    else {
                      uVar9 = (ulong)uVar5;
                      pcVar11 = "vol0";
                      uStackY_1d0 = 0x35;
                    }
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                           ,uStackY_1d0,"ref_dist_pierce",uVar9,pcVar11);
                    pcVar11 = "hits?";
                    uVar7 = 0x9a;
                    goto LAB_0013d4af;
                  }
                }
LAB_0013d65b:
                lVar8 = lVar8 + 1;
                goto LAB_0013d5e3;
              }
              uVar9 = (ulong)uVar5;
              pcVar11 = "touch";
              uVar7 = 0x91;
            }
            else {
              if ((filename != (char *)0x0) && (0 < *n_collisions)) {
                __s = fopen(filename,"w");
                if (__s == (FILE *)0x0) {
                  printf("unable to open %s\n",filename);
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                         ,0xb1,"ref_dist_collisions","unable to open file");
                  return 2;
                }
                fwrite("title=\"tecplot refine surface self intersections\"\n",0x32,1,__s);
                fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
                uVar5 = *n_collisions;
                uVar3 = collision_node->n;
                if (uVar5 != uVar3) {
                  pcVar11 = "node miscount";
                  uVar7 = 0xb4;
LAB_0013dc0e:
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c"
                         ,uVar7,"ref_dist_collisions",pcVar11,(long)(int)uVar5,(long)(int)uVar3);
                  return 1;
                }
                uVar3 = collision_faceid->n;
                if (uVar5 != uVar3) {
                  pcVar11 = "faceid miscount";
                  uVar7 = 0xb5;
                  goto LAB_0013dc0e;
                }
                fprintf(__s,"zone t=\"intersect\", i=%d, datapacking=%s\n",(ulong)uVar5,"point");
                for (lVar10 = 0; lVar10 < collision_node->n; lVar10 = lVar10 + 1) {
                  lVar8 = (long)collision_node->value[lVar10];
                  pRVar4 = ref_node->real;
                  fprintf(__s,"# intersection %d face id\n%f %f %f\n",pRVar4[lVar8 * 0xf],
                          pRVar4[lVar8 * 0xf + 1],pRVar4[lVar8 * 0xf + 2],
                          (ulong)(uint)collision_faceid->value[lVar10]);
                }
                fclose(__s);
              }
              uVar5 = ref_list_free(ref_list);
              if (uVar5 == 0) {
                uVar5 = ref_list_free(collision_faceid);
                if (uVar5 == 0) {
                  uVar5 = ref_list_free(collision_node);
                  if (uVar5 == 0) {
                    uVar5 = ref_search_free(ref_search);
                    if (uVar5 == 0) {
                      uVar5 = ref_edge_free(ref_edge);
                      if (uVar5 == 0) {
                        return 0;
                      }
                      uVar9 = (ulong)uVar5;
                      pcVar11 = "free";
                      uVar7 = 199;
                    }
                    else {
                      uVar9 = (ulong)uVar5;
                      pcVar11 = "free";
                      uVar7 = 0xc6;
                    }
                  }
                  else {
                    uVar9 = (ulong)uVar5;
                    pcVar11 = "free";
                    uVar7 = 0xc5;
                  }
                }
                else {
                  uVar9 = (ulong)uVar5;
                  pcVar11 = "free";
                  uVar7 = 0xc4;
                }
              }
              else {
                uVar9 = (ulong)uVar5;
                pcVar11 = "free";
                uVar7 = 0xc3;
              }
            }
            goto LAB_0013d4af;
          }
          uVar9 = (ulong)uVar5;
          pcVar11 = "create list";
          uVar7 = 0x89;
        }
        else {
          uVar9 = (ulong)uVar5;
          pcVar11 = "create faceid list";
          uVar7 = 0x88;
        }
      }
      else {
        uVar9 = (ulong)uVar5;
        pcVar11 = "create node list";
        uVar7 = 0x87;
      }
    }
    else {
      uVar9 = (ulong)uVar5;
      pcVar11 = "create search";
      uVar7 = 0x81;
    }
  }
  else {
    uVar9 = (ulong)uVar5;
    pcVar11 = "create edge";
    uVar7 = 0x80;
  }
LAB_0013d4af:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dist.c",uVar7,
         "ref_dist_collisions",uVar9,pcVar11);
  return (REF_STATUS)uVar9;
LAB_0013d8ba:
  uVar5 = ref_list_erase(ref_list);
  lVar10 = lVar10 + 1;
  if (uVar5 != 0) goto code_r0x0013d8dc;
  goto LAB_0013d510;
code_r0x0013d8dc:
  uVar9 = (ulong)uVar5;
  pcVar11 = "erase";
  uVar7 = 0xa9;
  goto LAB_0013d4af;
}

Assistant:

REF_FCN REF_STATUS ref_dist_collisions(REF_GRID ref_grid, REF_BOOL report,
                                       const char *filename,
                                       REF_INT *n_collisions) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_INT item;
  REF_INT edge;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius, scale = 1.01;
  REF_BOOL pierce;
  REF_SEARCH ref_search;
  REF_LIST ref_list, collision_node, collision_faceid;

  *n_collisions = 0;

  RSS(ref_edge_create(&ref_edge, ref_grid), "create edge");
  RSS(ref_search_create(&ref_search, ref_cell_n(ref_cell)), "create search");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_dist_bounding_sphere3(ref_node, nodes, center, &radius), "b");
    RSS(ref_search_insert(ref_search, cell, center, scale * radius), "insert");
  }

  RSS(ref_list_create(&collision_node), "create node list");
  RSS(ref_list_create(&collision_faceid), "create faceid list");
  RSS(ref_list_create(&ref_list), "create list");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    RSS(ref_dist_bounding_sphere2(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                                  ref_edge_e2n(ref_edge, 1, edge), center,
                                  &radius),
        "b");
    RSS(ref_search_touching(ref_search, ref_list, center, scale * radius),
        "touch");
    each_ref_list_item(ref_list, item) {
      cell = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
      if (ref_dist_exclude(ref_edge_e2n(ref_edge, 0, edge),
                           ref_edge_e2n(ref_edge, 1, edge), nodes))
        continue;
      RSS(ref_dist_pierce(ref_node, ref_edge_e2n(ref_edge, 0, edge),
                          ref_edge_e2n(ref_edge, 1, edge), nodes, &pierce),
          "hits?");
      if (pierce) {
        RSS(ref_list_push(collision_node, nodes[0]), "push node");
        RSS(ref_list_push(collision_faceid, nodes[ref_cell_id_index(ref_cell)]),
            "push faceid");
        (*n_collisions) += 1;
        if (report) {
          printf("%f %f %f # self intersection of face %d\n",
                 ref_node_xyz(ref_node, 0, nodes[0]),
                 ref_node_xyz(ref_node, 1, nodes[0]),
                 ref_node_xyz(ref_node, 2, nodes[0]),
                 nodes[ref_cell_id_index(ref_cell)]);
        }
      }
    }
    RSS(ref_list_erase(ref_list), "erase");
  }

  if (NULL != filename && (*n_collisions) > 0) {
    FILE *file;
    REF_INT faceid, node;
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine surface self intersections\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"\n");
    REIS(*n_collisions, ref_list_n(collision_node), "node miscount");
    REIS(*n_collisions, ref_list_n(collision_faceid), "faceid miscount");
    fprintf(file, "zone t=\"intersect\", i=%d, datapacking=%s\n", *n_collisions,
            "point");
    each_ref_list_item(collision_node, item) {
      node = ref_list_value(collision_node, item);
      faceid = ref_list_value(collision_faceid, item);
      fprintf(file, "# intersection %d face id\n%f %f %f\n", faceid,
              ref_node_xyz(ref_node, 0, node), ref_node_xyz(ref_node, 1, node),
              ref_node_xyz(ref_node, 2, node));
    }

    fclose(file);
  }

  RSS(ref_list_free(ref_list), "free");
  RSS(ref_list_free(collision_faceid), "free");
  RSS(ref_list_free(collision_node), "free");
  RSS(ref_search_free(ref_search), "free");
  RSS(ref_edge_free(ref_edge), "free");

  return REF_SUCCESS;
}